

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.h
# Opt level: O0

void __thiscall
slang::ast::CaseAssertionExpr::visitExprs<slang::ast::builtins::SequenceMethodExprVisitor&>
          (CaseAssertionExpr *this,SequenceMethodExprVisitor *visitor)

{
  bool bVar1;
  reference ppEVar2;
  SequenceMethodExprVisitor *in_RDI;
  Expression *e;
  iterator __end4;
  iterator __begin4;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range4;
  ItemGroup *item;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL> *__range3;
  Expression *in_stack_ffffffffffffffb0;
  iterator in_stack_ffffffffffffffb8;
  iterator in_stack_ffffffffffffffc0;
  __normal_iterator<const_slang::ast::CaseAssertionExpr::ItemGroup_*,_std::span<const_slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL>_>
  local_20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_18;
  
  Expression::visit<slang::ast::builtins::SequenceMethodExprVisitor&>
            (in_stack_ffffffffffffffb0,in_RDI);
  local_18 = &(in_RDI->name).field_2;
  local_20._M_current =
       (ItemGroup *)
       std::span<const_slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL> *)
                  in_RDI);
  std::span<const_slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL>::end
            ((span<const_slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL> *)
             in_stack_ffffffffffffffb8._M_current);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::CaseAssertionExpr::ItemGroup_*,_std::span<const_slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::CaseAssertionExpr::ItemGroup_*,_std::span<const_slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffffb0,
                       (__normal_iterator<const_slang::ast::CaseAssertionExpr::ItemGroup_*,_std::span<const_slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL>_>
                        *)in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_slang::ast::CaseAssertionExpr::ItemGroup_*,_std::span<const_slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL>_>
    ::operator*(&local_20);
    in_stack_ffffffffffffffc0 =
         std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                   ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)in_RDI);
    in_stack_ffffffffffffffb8 =
         std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
                   (in_stack_ffffffffffffffb8._M_current);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                        ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                          *)in_stack_ffffffffffffffb0,
                         (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                          *)in_RDI);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      ppEVar2 = __gnu_cxx::
                __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                ::operator*((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                             *)&stack0xffffffffffffffc0);
      in_stack_ffffffffffffffb0 = *ppEVar2;
      Expression::visit<slang::ast::builtins::SequenceMethodExprVisitor&>
                (in_stack_ffffffffffffffb0,in_RDI);
      __gnu_cxx::
      __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
      ::operator++((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                    *)&stack0xffffffffffffffc0);
    }
    not_null<const_slang::ast::AssertionExpr_*>::operator->
              ((not_null<const_slang::ast::AssertionExpr_*> *)0x8fe893);
    AssertionExpr::visit<slang::ast::builtins::SequenceMethodExprVisitor>
              ((AssertionExpr *)in_stack_ffffffffffffffc0._M_current,
               (SequenceMethodExprVisitor *)in_stack_ffffffffffffffb8._M_current);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::CaseAssertionExpr::ItemGroup_*,_std::span<const_slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL>_>
    ::operator++(&local_20);
  }
  if (in_RDI[1].context != (ASTContext *)0x0) {
    AssertionExpr::visit<slang::ast::builtins::SequenceMethodExprVisitor>
              ((AssertionExpr *)in_stack_ffffffffffffffc0._M_current,
               (SequenceMethodExprVisitor *)in_stack_ffffffffffffffb8._M_current);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        expr.visit(visitor);
        for (auto& item : items) {
            for (auto e : item.expressions)
                e->visit(visitor);
            item.body->visit(visitor);
        }

        if (defaultCase)
            defaultCase->visit(visitor);
    }